

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O2

void __thiscall
AddressFactory_GetAddressByLockingScript_Test::TestBody
          (AddressFactory_GetAddressByLockingScript_Test *this)

{
  ByteData *__x;
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  Script script;
  AddressFactory factory;
  Address address;
  
  cfd::AddressFactory::AddressFactory(&factory);
  cfd::core::Script::Script(&script);
  cfd::core::Address::Address(&address);
  std::__cxx11::string::string
            ((string *)&gtest_ar_2,
             "210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac",
             (allocator *)&gtest_ar);
  cfd::core::Script::Script((Script *)&gtest_ar_1,(string *)&gtest_ar_2);
  cfd::core::Script::operator=(&script,(Script *)&gtest_ar_1);
  cfd::core::Script::~Script((Script *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)&gtest_ar_1,&factory,&script);
      cfd::core::Address::operator=(&address,(Address *)&gtest_ar_1);
      cfd::core::Address::~Address((Address *)&gtest_ar_1);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x219,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  __x = &address.hash_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2,&__x->data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData *)&gtest_ar_2);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "49a011f97ba520dab063f309bad59daeb30de101");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_4_ = address.addr_type_;
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&gtest_ar_1,"address.GetAddressType()","AddressType::kP2pkhAddress",
             (AddressType *)&gtest_ar_2,(AddressType *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_1,&address);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string
            ((string *)&gtest_ar_2,"76a91449a011f97ba520dab063f309bad59daeb30de10188ac",
             (allocator *)&gtest_ar);
  cfd::core::Script::Script((Script *)&gtest_ar_1,(string *)&gtest_ar_2);
  cfd::core::Script::operator=(&script,(Script *)&gtest_ar_1);
  cfd::core::Script::~Script((Script *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)&gtest_ar_1,&factory,&script);
      cfd::core::Address::operator=(&address,(Address *)&gtest_ar_1);
      cfd::core::Address::~Address((Address *)&gtest_ar_1);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21f,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2,&__x->data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData *)&gtest_ar_2);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "49a011f97ba520dab063f309bad59daeb30de101");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x220,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_4_ = address.addr_type_;
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&gtest_ar_1,"address.GetAddressType()","AddressType::kP2pkhAddress",
             (AddressType *)&gtest_ar_2,(AddressType *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x221,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_1,&address);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x222,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string
            ((string *)&gtest_ar_2,"a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487",
             (allocator *)&gtest_ar);
  cfd::core::Script::Script((Script *)&gtest_ar_1,(string *)&gtest_ar_2);
  cfd::core::Script::operator=(&script,(Script *)&gtest_ar_1);
  cfd::core::Script::~Script((Script *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)&gtest_ar_1,&factory,&script);
      cfd::core::Address::operator=(&address,(Address *)&gtest_ar_1);
      cfd::core::Address::~Address((Address *)&gtest_ar_1);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x225,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2,&__x->data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData *)&gtest_ar_2);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"address.GetHash().GetHex().c_str()",
             "\"f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x226,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_4_ = address.addr_type_;
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&gtest_ar_1,"address.GetAddressType()","AddressType::kP2shAddress",
             (AddressType *)&gtest_ar_2,(AddressType *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x227,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_1,&address);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"address.GetAddress().c_str()",
             "\"3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x228,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string
            ((string *)&gtest_ar_2,"0014925d4028880bd0c9d68fbc7fc7dfee976698629c",
             (allocator *)&gtest_ar);
  cfd::core::Script::Script((Script *)&gtest_ar_1,(string *)&gtest_ar_2);
  cfd::core::Script::operator=(&script,(Script *)&gtest_ar_1);
  cfd::core::Script::~Script((Script *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)&gtest_ar_1,&factory,&script);
      cfd::core::Address::operator=(&address,(Address *)&gtest_ar_1);
      cfd::core::Address::~Address((Address *)&gtest_ar_1);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22b,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2,&__x->data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData *)&gtest_ar_2);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"address.GetHash().GetHex().c_str()",
             "\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_4_ = address.addr_type_;
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&gtest_ar_1,"address.GetAddressType()","AddressType::kP2wpkhAddress",
             (AddressType *)&gtest_ar_2,(AddressType *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_1,&address);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"address.GetAddress().c_str()",
             "\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string
            ((string *)&gtest_ar_2,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437",
             (allocator *)&gtest_ar);
  cfd::core::Script::Script((Script *)&gtest_ar_1,(string *)&gtest_ar_2);
  cfd::core::Script::operator=(&script,(Script *)&gtest_ar_1);
  cfd::core::Script::~Script((Script *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)&gtest_ar_1,&factory,&script);
      cfd::core::Address::operator=(&address,(Address *)&gtest_ar_1);
      cfd::core::Address::~Address((Address *)&gtest_ar_1);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x231,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2,&__x->data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData *)&gtest_ar_2);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"address.GetHash().GetHex().c_str()",
             "\"87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x232,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_4_ = address.addr_type_;
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&gtest_ar_1,"address.GetAddressType()","AddressType::kP2wshAddress",
             (AddressType *)&gtest_ar_2,(AddressType *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x233,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_1,&address);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"address.GetAddress().c_str()",
             "\"bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x234,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string
            ((string *)&gtest_ar_2,
             "51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
             (allocator *)&gtest_ar);
  cfd::core::Script::Script((Script *)&gtest_ar_1,(string *)&gtest_ar_2);
  cfd::core::Script::operator=(&script,(Script *)&gtest_ar_1);
  cfd::core::Script::~Script((Script *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)&gtest_ar_1,&factory,&script);
      cfd::core::Address::operator=(&address,(Address *)&gtest_ar_1);
      cfd::core::Address::~Address((Address *)&gtest_ar_1);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x237,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2,&__x->data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData *)&gtest_ar_2);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"address.GetHash().GetHex().c_str()",
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x238,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_4_ = address.addr_type_;
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&gtest_ar_1,"address.GetAddressType()","AddressType::kTaprootAddress",
             (AddressType *)&gtest_ar_2,(AddressType *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x239,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_1,&address);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"address.GetAddress().c_str()",
             "\"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string
            ((string *)&gtest_ar_2,
             "512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799",
             (allocator *)&gtest_ar);
  cfd::core::Script::Script((Script *)&gtest_ar_1,(string *)&gtest_ar_2);
  cfd::core::Script::operator=(&script,(Script *)&gtest_ar_1);
  cfd::core::Script::~Script((Script *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)&gtest_ar_1,&factory,&script);
      cfd::core::Address::operator=(&address,(Address *)&gtest_ar_1);
      cfd::core::Address::~Address((Address *)&gtest_ar_1);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23d,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2,&__x->data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData *)&gtest_ar_2);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"address.GetHash().GetHex().c_str()",
             "\"88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_4_ = address.addr_type_;
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&gtest_ar_1,"address.GetAddressType()","AddressType::kTaprootAddress",
             (AddressType *)&gtest_ar_2,(AddressType *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_1,&address);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"address.GetAddress().c_str()",
             "\"bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x240,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::Address::~Address(&address);
  cfd::core::Script::~Script(&script);
  cfd::AddressFactory::~AddressFactory(&factory);
  return;
}

Assistant:

TEST(AddressFactory, GetAddressByLockingScript)
{
  AddressFactory factory;
  Script script;
  Address address;

  script = Script("210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("76a91449a011f97ba520dab063f309bad59daeb30de10188ac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2shAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");

  script = Script("0014925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wpkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");

  script = Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wshAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  
  script = Script("51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  
  script = Script("512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
}